

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O3

string * __thiscall
cfd::api::KeyApi::GetPubkeyFromPrivkey
          (string *__return_storage_ptr__,KeyApi *this,string *privkey,bool is_compressed)

{
  pointer puVar1;
  bool bVar2;
  NetType net_type;
  Privkey local_68;
  NetType local_3c;
  Privkey local_38;
  
  core::Privkey::Privkey(&local_38);
  local_3c = kMainnet;
  bVar2 = core::Privkey::HasWif(privkey,&local_3c,(bool *)0x0);
  if (bVar2) {
    core::Privkey::FromWif(&local_68,privkey,local_3c,is_compressed);
  }
  else {
    core::Privkey::Privkey(&local_68,privkey,kMainnet,true);
  }
  puVar1 = local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 == (pointer)0x0) {
    local_38.is_compressed_ = local_68.is_compressed_;
    local_38._25_3_ = local_68._25_3_;
    local_38.net_type_ = local_68.net_type_;
  }
  else {
    operator_delete(puVar1);
    local_38.is_compressed_ = local_68.is_compressed_;
    local_38._25_3_ = local_68._25_3_;
    local_38.net_type_ = local_68.net_type_;
    if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  core::Privkey::GeneratePubkey((Pubkey *)&local_68,&local_38,is_compressed);
  core::Pubkey::GetHex_abi_cxx11_(__return_storage_ptr__,(Pubkey *)&local_68);
  if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string KeyApi::GetPubkeyFromPrivkey(
    const std::string& privkey, bool is_compressed) const {
  Privkey key;
  NetType net_type = NetType::kMainnet;

  bool has_wif = Privkey::HasWif(privkey, &net_type, nullptr);
  if (has_wif) {
    key = Privkey::FromWif(privkey, net_type, is_compressed);
  } else {
    key = Privkey(privkey);
  }
  return key.GeneratePubkey(is_compressed).GetHex();
}